

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcAnnotationTextOccurrence::IfcAnnotationTextOccurrence
          (IfcAnnotationTextOccurrence *this)

{
  *(undefined ***)&(this->super_IfcAnnotationOccurrence).field_0x90 = &PTR__Object_008a0070;
  *(undefined8 *)&this->field_0x98 = 0;
  *(char **)&this->field_0xa0 = "IfcAnnotationTextOccurrence";
  IfcStyledItem::IfcStyledItem((IfcStyledItem *)this,&PTR_construction_vtable_24__0095b388);
  *(undefined8 *)&(this->super_IfcAnnotationOccurrence).super_IfcStyledItem = 0x95b2c8;
  *(undefined8 *)&(this->super_IfcAnnotationOccurrence).field_0x90 = 0x95b368;
  (this->super_IfcAnnotationOccurrence).super_IfcStyledItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStyledItem,_3UL>._vptr_ObjectHelper =
       (_func_int **)0x95b2f0;
  *(undefined8 *)&(this->super_IfcAnnotationOccurrence).super_IfcStyledItem.field_0x70 = 0x95b318;
  *(undefined8 *)&(this->super_IfcAnnotationOccurrence).super_IfcStyledItem.field_0x80 = 0x95b340;
  return;
}

Assistant:

IfcAnnotationTextOccurrence() : Object("IfcAnnotationTextOccurrence") {}